

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

DdNode * cuddAllocNode(DdManager *unique)

{
  DdNode *pDVar1;
  _func_void_long *p_Var2;
  int iVar3;
  DdNode **ppDVar4;
  DdNode *pDVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  pDVar5 = unique->nextFree;
  if (pDVar5 == (DdNode *)0x0) {
    if (unique->maxLive < (unique->keys + unique->keysZ) - (unique->dead + unique->deadZ)) {
      unique->errorCode = CUDD_TOO_MANY_NODES;
    }
    else {
      if ((unique->stash == (char *)0x0) || (unique->maxmemhard < unique->memused)) {
        cuddGarbageCollect(unique,1);
        pDVar5 = unique->nextFree;
        if (pDVar5 != (DdNode *)0x0) goto LAB_0066c4a2;
      }
      p_Var2 = Extra_UtilMMoutOfMemory;
      uVar8 = unique->memused;
      if (unique->maxmemhard < uVar8) {
        unique->errorCode = CUDD_MAX_MEM_EXCEEDED;
      }
      else {
        ppDVar4 = (DdNode **)malloc(0xa000);
        Extra_UtilMMoutOfMemory = p_Var2;
        if (ppDVar4 != (DdNode **)0x0) {
LAB_0066c572:
          unique->memused = uVar8 + 0x9fd8;
          *ppDVar4 = (DdNode *)unique->memoryList;
          unique->memoryList = ppDVar4;
          uVar7 = 0x20 - ((uint)ppDVar4 & 0x1f);
          pDVar5 = (DdNode *)((ulong)(uVar7 & 0xfffffff8) + (long)ppDVar4);
          if (((ulong)pDVar5 & 0x1f) != 0) {
            __assert_fail("((ptruint) mem & (32 - 1)) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cudd/cuddTable.c"
                          ,0x139,"DdNode *cuddAllocNode(DdManager *)");
          }
          lVar6 = 0x3fd;
          pDVar1 = (DdNode *)(ppDVar4 + (uVar7 >> 3));
          do {
            pDVar1->ref = 0;
            pDVar1->next = pDVar1 + 1;
            lVar6 = lVar6 + -1;
            pDVar1 = pDVar1 + 1;
          } while (lVar6 != 0);
          pDVar5[0x3fd].ref = 0;
          pDVar5[0x3fd].next = (DdNode *)0x0;
          goto LAB_0066c4a2;
        }
        iVar3 = cuddGarbageCollect(unique,1);
        if (iVar3 != 0) {
          pDVar5 = unique->nextFree;
          goto LAB_0066c4a2;
        }
        if (unique->stash != (char *)0x0) {
          free(unique->stash);
          unique->stash = (char *)0x0;
          cuddSlowTableGrowth(unique);
          ppDVar4 = (DdNode **)malloc(0xa000);
          if (ppDVar4 != (DdNode **)0x0) {
            uVar8 = unique->memused;
            goto LAB_0066c572;
          }
        }
        (*Extra_UtilMMoutOfMemory)(0x9fd8);
        unique->errorCode = CUDD_MEMORY_OUT;
      }
    }
    pDVar5 = (DdNode *)0x0;
  }
  else {
LAB_0066c4a2:
    lVar6 = unique->allocated + 1;
    unique->allocated = lVar6;
    unique->nextFree = pDVar5->next;
    pDVar5->Id = lVar6 * 0x10;
  }
  return pDVar5;
}

Assistant:

DdNode *
cuddAllocNode(
  DdManager * unique)
{
    int i;
    DdNodePtr *mem;
    DdNode *list, *node;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (unique->nextFree == NULL) {     /* free list is empty */
        /* Check for exceeded limits. */
        if ((unique->keys - unique->dead) + (unique->keysZ - unique->deadZ) >
            unique->maxLive) {
            unique->errorCode = CUDD_TOO_MANY_NODES;
            return(NULL);
        }
        if (unique->stash == NULL || unique->memused > unique->maxmemhard) {
            (void) cuddGarbageCollect(unique,1);
            mem = NULL;
        }
        if (unique->nextFree == NULL) {
            if (unique->memused > unique->maxmemhard) {
                unique->errorCode = CUDD_MAX_MEM_EXCEEDED;
                return(NULL);
            }
            /* Try to allocate a new block. */
            saveHandler = MMoutOfMemory;
            MMoutOfMemory = Cudd_OutOfMem;
//            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 1);
            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 2);
            MMoutOfMemory = saveHandler;
            if (mem == NULL) {
                /* No more memory: Try collecting garbage. If this succeeds,
                ** we end up with mem still NULL, but unique->nextFree !=
                ** NULL. */
                if (cuddGarbageCollect(unique,1) == 0) {
                    /* Last resort: Free the memory stashed away, if there
                    ** any. If this succeeeds, mem != NULL and
                    ** unique->nextFree still NULL. */
                    if (unique->stash != NULL) {
                        ABC_FREE(unique->stash);
                        unique->stash = NULL;
                        /* Inhibit resizing of tables. */
                        cuddSlowTableGrowth(unique);
                        /* Now try again. */
//                        mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 1);
                        mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 2);
                    }
                    if (mem == NULL) {
                        /* Out of luck. Call the default handler to do
                        ** whatever it specifies for a failed malloc.
                        ** If this handler returns, then set error code,
                        ** print warning, and return. */
                        (*MMoutOfMemory)(sizeof(DdNode)*(DD_MEM_CHUNK + 1));
                        unique->errorCode = CUDD_MEMORY_OUT;
#ifdef DD_VERBOSE
                        (void) fprintf(unique->err,
                                       "cuddAllocNode: out of memory");
                        (void) fprintf(unique->err, "Memory in use = %lu\n",
                                       unique->memused);
#endif
                        return(NULL);
                    }
                }
            }
            if (mem != NULL) {  /* successful allocation; slice memory */
                ptruint offset;
                unique->memused += (DD_MEM_CHUNK + 1) * sizeof(DdNode);
                mem[0] = (DdNodePtr) unique->memoryList;
                unique->memoryList = mem;

                /* Here we rely on the fact that a DdNode is as large as 4 pointers.  */
//                offset = (ptruint) mem & (sizeof(DdNode) - 1);
//                mem += (sizeof(DdNode) - offset) / sizeof(DdNodePtr);
//                assert(((ptruint) mem & (sizeof(DdNode) - 1)) == 0);
//                list = (DdNode *) mem;
                offset = (ptruint) mem & (32 - 1);
                mem += (32 - offset) / sizeof(DdNodePtr);
                assert(((ptruint) mem & (32 - 1)) == 0);
                list = (DdNode *) mem;

                i = 1;
                do {
                    list[i - 1].ref = 0;
                    list[i - 1].next = &list[i];
                } while (++i < DD_MEM_CHUNK);

                list[DD_MEM_CHUNK-1].ref = 0;
                list[DD_MEM_CHUNK-1].next = NULL;

                unique->nextFree = &list[0];
            }
        }
    }
    unique->allocated++;
    node = unique->nextFree;
    unique->nextFree = node->next;
    node->Id = (unique->allocated<<4);
    return(node);

}